

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_thread.cc
# Opt level: O0

void __thiscall rtc::PlatformThread::Run(PlatformThread *this)

{
  bool bVar1;
  ulong uVar2;
  char *name;
  PlatformThread *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    name = (char *)std::__cxx11::string::c_str();
    SetCurrentThreadName(name);
  }
  do {
    bVar1 = (*this->run_function_)(this->obj_);
    if (!bVar1) {
      return;
    }
    bVar1 = Event::Wait(&this->stop_event_,0);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void PlatformThread::Run() {
  if (!name_.empty())
    rtc::SetCurrentThreadName(name_.c_str());
  do {
    // The interface contract of Start/Stop is that for a successful call to
    // Start, there should be at least one call to the run function.  So we
    // call the function before checking |stop_|.
    if (!run_function_(obj_))
      break;
#if defined(WEBRTC_WIN)
    // Alertable sleep to permit RaiseFlag to run and update |stop_|.
    SleepEx(0, true);
  } while (!stop_);
#else
  }